

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O2

void __thiscall cmsys::Directory::~Directory(Directory *this)

{
  DirectoryInternals *this_00;
  
  this_00 = this->Internal;
  if (this_00 != (DirectoryInternals *)0x0) {
    DirectoryInternals::~DirectoryInternals(this_00);
  }
  operator_delete(this_00,0x38);
  return;
}

Assistant:

Directory::~Directory()
{
  delete this->Internal;
}